

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,HeapType type)

{
  bool bVar1;
  BasicHeapType BVar2;
  uint uVar3;
  HeapTypeKind HVar4;
  ostream *poVar5;
  Struct *pSVar6;
  const_iterator cVar7;
  undefined8 unaff_R12;
  ulong uVar8;
  optional<wasm::HeapType> oVar9;
  undefined1 local_98 [8];
  TypeNames names;
  Signature local_48;
  HeapType local_38;
  HeapType type_local;
  
  local_38.id = type.id;
  if (type.id < 0x7d) {
    bVar1 = HeapType::isShared(&local_38);
    if (bVar1) {
      std::operator<<(this->os,"(shared ");
    }
    BVar2 = HeapType::getBasic(&local_38,Unshared);
    uVar3 = BVar2 << 0x1d | BVar2 - ext >> 3;
    if (uVar3 < 0xf) {
      std::operator<<(this->os,&DAT_00e5b818 + *(int *)(&DAT_00e5b818 + (ulong)uVar3 * 4));
    }
    bVar1 = HeapType::isShared(&local_38);
    if (bVar1) {
      std::operator<<(this->os,')');
    }
    poVar5 = this->os;
  }
  else {
    std::function<wasm::TypeNames_(wasm::HeapType)>::operator()
              ((TypeNames *)local_98,&this->generator,type);
    std::operator<<(this->os,"(type ");
    poVar5 = Name::print((Name *)local_98,this->os);
    std::operator<<(poVar5,' ');
    bVar1 = isTemp(local_38);
    if (bVar1) {
      std::operator<<(this->os,"(; temp ;) ");
    }
    oVar9 = HeapType::getDeclaredSuperType(&local_38);
    if ((((undefined1  [16])
          oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
         (undefined1  [16])0x0) || (bVar1 = HeapType::isOpen(&local_38), bVar1)) {
      std::operator<<(this->os,"(sub ");
      bVar1 = HeapType::isOpen(&local_38);
      if (!bVar1) {
        std::operator<<(this->os,"final ");
      }
      uVar8 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      if (((undefined1  [16])
           oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        printHeapTypeName(this,oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
        std::operator<<(this->os,' ');
      }
    }
    else {
      uVar8 = 0;
    }
    bVar1 = HeapType::isShared(&local_38);
    if (bVar1) {
      std::operator<<(this->os,"(shared ");
    }
    oVar9 = HeapType::getDescribedType(&local_38);
    if (((undefined1  [16])
         oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      std::operator<<(this->os,"(describes ");
      printHeapTypeName(this,oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
      std::operator<<(this->os,' ');
    }
    oVar9 = HeapType::getDescriptorType(&local_38);
    if (((undefined1  [16])
         oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      std::operator<<(this->os,"(descriptor ");
      printHeapTypeName(this,oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
      std::operator<<(this->os,' ');
    }
    HVar4 = HeapType::getKind(&local_38);
    switch(HVar4) {
    case Basic:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x743);
    case Func:
      local_48 = HeapType::getSignature(&local_38);
      print(this,&local_48);
      break;
    case Struct:
      pSVar6 = HeapType::getStruct(&local_38);
      std::operator<<(this->os,"(struct");
      names.fieldNames._M_h._M_single_bucket._4_4_ = (uint)uVar8;
      uVar3 = 0;
      while( true ) {
        local_48.params.id._0_4_ = uVar3;
        if ((ulong)((long)(pSVar6->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pSVar6->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4) <= (ulong)uVar3) break;
        std::operator<<(this->os," (field ");
        cVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&names.name.super_IString.str._M_str,(key_type *)&local_48);
        if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>._M_cur
            != (__node_type *)0x0) {
          poVar5 = Name::print((Name *)((long)cVar7.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>
                                              ._M_cur + 0x10),this->os);
          std::operator<<(poVar5,' ');
        }
        print(this,(pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start + (uint)local_48.params.id);
        std::operator<<(this->os,')');
        uVar3 = (uint)local_48.params.id + 1;
      }
      std::operator<<(this->os,")");
      uVar8 = (ulong)names.fieldNames._M_h._M_single_bucket._4_4_;
      break;
    case Array:
      HeapType::getArray((HeapType *)&local_48);
      print(this,(Array *)&local_48);
      break;
    case Cont:
      local_48.params.id = (uintptr_t)HeapType::getContinuation(&local_38);
      print(this,(Continuation *)&local_48);
    }
    oVar9 = HeapType::getDescriptorType(&local_38);
    if (((undefined1  [16])
         oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      std::operator<<(this->os,')');
    }
    oVar9 = HeapType::getDescribedType(&local_38);
    if (((undefined1  [16])
         oVar9.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      std::operator<<(this->os,')');
    }
    bVar1 = HeapType::isShared(&local_38);
    if (bVar1) {
      std::operator<<(this->os,')');
    }
    if ((char)uVar8 != '\0') {
      std::operator<<(this->os,')');
    }
    poVar5 = std::operator<<(this->os,')');
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&names.name.super_IString.str._M_str);
  }
  return poVar5;
}

Assistant:

std::ostream& TypePrinter::print(HeapType type) {
  if (type.isBasic()) {
    if (type.isShared()) {
      os << "(shared ";
    }
    switch (type.getBasic(Unshared)) {
      case HeapType::ext:
        os << "extern";
        break;
      case HeapType::func:
        os << "func";
        break;
      case HeapType::cont:
        os << "cont";
        break;
      case HeapType::any:
        os << "any";
        break;
      case HeapType::eq:
        os << "eq";
        break;
      case HeapType::i31:
        os << "i31";
        break;
      case HeapType::struct_:
        os << "struct";
        break;
      case HeapType::array:
        os << "array";
        break;
      case HeapType::exn:
        os << "exn";
        break;
      case HeapType::string:
        os << "string";
        break;
      case HeapType::none:
        os << "none";
        break;
      case HeapType::noext:
        os << "noextern";
        break;
      case HeapType::nofunc:
        os << "nofunc";
        break;
      case HeapType::nocont:
        os << "nocont";
        break;
      case HeapType::noexn:
        os << "noexn";
        break;
    }
    if (type.isShared()) {
      os << ')';
    }
    return os;
  }

  auto names = generator(type);

  os << "(type ";
  names.name.print(os) << ' ';

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }

  bool useSub = false;
  auto super = type.getDeclaredSuperType();
  if (super || type.isOpen()) {
    useSub = true;
    os << "(sub ";
    if (!type.isOpen()) {
      os << "final ";
    }
    if (super) {
      printHeapTypeName(*super);
      os << ' ';
    }
  }
  if (type.isShared()) {
    os << "(shared ";
  }
  if (auto desc = type.getDescribedType()) {
    os << "(describes ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  if (auto desc = type.getDescriptorType()) {
    os << "(descriptor ";
    printHeapTypeName(*desc);
    os << ' ';
  }
  switch (type.getKind()) {
    case HeapTypeKind::Func:
      print(type.getSignature());
      break;
    case HeapTypeKind::Struct:
      print(type.getStruct(), names.fieldNames);
      break;
    case HeapTypeKind::Array:
      print(type.getArray());
      break;
    case HeapTypeKind::Cont:
      print(type.getContinuation());
      break;
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  if (type.getDescriptorType()) {
    os << ')';
  }
  if (type.getDescribedType()) {
    os << ')';
  }
  if (type.isShared()) {
    os << ')';
  }
  if (useSub) {
    os << ')';
  }
  return os << ')';
}